

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O3

void __thiscall Assimp::FBX::Document::ReadConnections(Document *this)

{
  _Base_ptr p_Var1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
  *p_Var2;
  Element *el;
  _Base_ptr *pp_Var3;
  int iVar4;
  const_iterator cVar5;
  Token *pTVar6;
  pointer src;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *dest;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
  _Var7;
  _Base_ptr p_Var8;
  Connection *this_00;
  _Base_ptr p_Var9;
  Token *t;
  Token *t_00;
  _Base_ptr p_Var10;
  long lVar11;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
  pVar12;
  key_type local_c0;
  string local_a0;
  _Base_ptr local_80;
  Document *local_78;
  uint64_t local_70;
  _Rb_tree_node_base *local_68;
  string local_60;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>,std::_Select1st<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>>
  *local_40;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>,std::_Select1st<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>>
  *local_38;
  
  p_Var2 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
            *)(this->parser->root)._M_t.
              super___uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>.
              _M_t.
              super__Tuple_impl<0UL,_Assimp::FBX::Scope_*,_std::default_delete<Assimp::FBX::Scope>_>
              .super__Head_base<0UL,_Assimp::FBX::Scope_*,_false>._M_head_impl;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_78 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Connections","");
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
          ::find(p_Var2,&local_c0);
  if (cVar5._M_node == &(p_Var2->_M_impl).super__Rb_tree_header._M_header) {
    lVar11 = 0;
  }
  else {
    lVar11 = *(long *)(cVar5._M_node + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((lVar11 == 0) ||
     (p_Var2 = *(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
                 **)(lVar11 + 0x20),
     p_Var2 == (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
                *)0x0)) {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"no Connections dictionary found","");
    Util::DOMError(&local_c0,(Element *)0x0);
  }
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"C","");
  pVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
           ::equal_range(p_Var2,&local_c0);
  local_68 = (_Rb_tree_node_base *)pVar12.second._M_node;
  _Var7 = pVar12.first._M_node;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (_Var7._M_node != local_68) {
    local_80 = &(local_78->objects)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_38 = (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>,std::_Select1st<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>>
                *)&local_78->src_connections;
    local_40 = (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>,std::_Select1st<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>>
                *)&local_78->dest_connections;
    local_70 = 0;
    do {
      el = *(Element **)(_Var7._M_node + 2);
      pTVar6 = GetRequiredToken(el,0);
      ParseTokenAsString_abi_cxx11_(&local_c0,(FBX *)pTVar6,t);
      iVar4 = std::__cxx11::string::compare((char *)&local_c0);
      if (iVar4 != 0) {
        pTVar6 = GetRequiredToken(el,1);
        src = (pointer)ParseTokenAsID(pTVar6);
        pTVar6 = GetRequiredToken(el,2);
        dest = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)ParseTokenAsID(pTVar6);
        iVar4 = std::__cxx11::string::compare((char *)&local_c0);
        if (iVar4 == 0) {
          pTVar6 = GetRequiredToken(el,3);
          ParseTokenAsString_abi_cxx11_(&local_60,(FBX *)pTVar6,t_00);
        }
        else {
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
        }
        p_Var8 = (local_78->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var9 = local_80;
        p_Var10 = p_Var8;
        if (p_Var8 == (_Base_ptr)0x0) {
LAB_005b0d0b:
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a0,"source object for connection does not exist","");
          Util::DOMWarning(&local_a0,el);
LAB_005b0d39:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          do {
            p_Var1 = p_Var10 + 1;
            if (*(pointer *)p_Var1 >= src) {
              p_Var9 = p_Var10;
            }
            pp_Var3 = &p_Var10->_M_left;
            p_Var10 = pp_Var3[*(pointer *)p_Var1 < src];
          } while (pp_Var3[*(pointer *)p_Var1 < src] != (_Base_ptr)0x0);
          if ((p_Var9 == local_80) || (p_Var10 = local_80, src < *(pointer *)(p_Var9 + 1)))
          goto LAB_005b0d0b;
          do {
            if (*(undefined1 **)(p_Var8 + 1) >= dest) {
              p_Var10 = p_Var8;
            }
            p_Var8 = (&p_Var8->_M_left)[*(undefined1 **)(p_Var8 + 1) < dest];
          } while (p_Var8 != (_Base_ptr)0x0);
          if ((p_Var10 == local_80) || (dest < *(undefined1 **)(p_Var10 + 1))) {
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a0,"destination object for connection does not exist","");
            Util::DOMWarning(&local_a0,el);
            goto LAB_005b0d39;
          }
          this_00 = (Connection *)operator_new(0x40);
          Connection::Connection(this_00,local_70,(uint64_t)src,(uint64_t)dest,&local_60,local_78);
          local_a0._M_dataplus._M_p = src;
          local_a0._M_string_length = (size_type)this_00;
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>,std::_Select1st<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>>
          ::_M_insert_equal<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>
                    (local_38,(pair<const_unsigned_long,_const_Assimp::FBX::Connection_*> *)
                              &local_a0);
          local_a0._M_dataplus._M_p = (pointer)dest;
          local_a0._M_string_length = (size_type)this_00;
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>,std::_Select1st<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>>
          ::_M_insert_equal<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>
                    (local_40,(pair<const_unsigned_long,_const_Assimp::FBX::Connection_*> *)
                              &local_a0);
          local_70 = local_70 + 1;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      _Var7._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var7._M_node);
    } while (_Var7._M_node != local_68);
  }
  return;
}

Assistant:

void Document::ReadConnections()
{
    const Scope& sc = parser.GetRootScope();
    // read property templates from "Definitions" section
    const Element* const econns = sc["Connections"];
    if(!econns || !econns->Compound()) {
        DOMError("no Connections dictionary found");
    }

    uint64_t insertionOrder = 0l;
    const Scope& sconns = *econns->Compound();
    const ElementCollection conns = sconns.GetCollection("C");
    for(ElementMap::const_iterator it = conns.first; it != conns.second; ++it) {
        const Element& el = *(*it).second;
        const std::string& type = ParseTokenAsString(GetRequiredToken(el,0));

        // PP = property-property connection, ignored for now
        // (tokens: "PP", ID1, "Property1", ID2, "Property2")
        if ( type == "PP" ) {
            continue;
        }

        const uint64_t src = ParseTokenAsID(GetRequiredToken(el,1));
        const uint64_t dest = ParseTokenAsID(GetRequiredToken(el,2));

        // OO = object-object connection
        // OP = object-property connection, in which case the destination property follows the object ID
        const std::string& prop = (type == "OP" ? ParseTokenAsString(GetRequiredToken(el,3)) : "");

        if(objects.find(src) == objects.end()) {
            DOMWarning("source object for connection does not exist",&el);
            continue;
        }

        // dest may be 0 (root node) but we added a dummy object before
        if(objects.find(dest) == objects.end()) {
            DOMWarning("destination object for connection does not exist",&el);
            continue;
        }

        // add new connection
        const Connection* const c = new Connection(insertionOrder++,src,dest,prop,*this);
        src_connections.insert(ConnectionMap::value_type(src,c));
        dest_connections.insert(ConnectionMap::value_type(dest,c));
    }
}